

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gb.c
# Opt level: O2

void gb_update_wave_channel(gb_sound_t *gb,SOUND *snd,UINT32 cycles)

{
  UINT8 UVar1;
  byte bVar2;
  char cVar3;
  INT8 IVar4;
  ushort uVar5;
  int iVar6;
  
  if (snd->on == true) {
    iVar6 = cycles + snd->cycles_left;
    snd->cycles_left = iVar6;
    while (1 < iVar6) {
      iVar6 = iVar6 + -2;
      snd->cycles_left = iVar6;
      uVar5 = snd->frequency_counter + 1 & 0x7ff;
      snd->frequency_counter = uVar5;
      snd->sample_reading = false;
      UVar1 = gb->gbMode;
      if (UVar1 == '\0') {
        if (uVar5 == 0) {
          snd->sample_reading = true;
          bVar2 = snd->offset;
          goto LAB_0014df92;
        }
        if (uVar5 == 0x7ff) {
          snd->offset = snd->offset + 1 & 0x1f;
        }
      }
      else if (uVar5 == 0) {
        snd->sample_reading = true;
        bVar2 = snd->offset;
        if (UVar1 == '\x01') {
          bVar2 = bVar2 + 1 & 0x1f;
          snd->offset = bVar2;
        }
LAB_0014df92:
        cVar3 = ((char)gb->snd_regs[(ulong)(bVar2 >> 1) + 0x20] >> ((~bVar2 & 1) << 2) & 0xfU) - 8;
        snd->current_sample = cVar3;
        if (gb->BoostWaveChn != '\0') {
          cVar3 = cVar3 * '\x02';
          snd->current_sample = cVar3;
        }
        if (snd->level == '\0') {
          IVar4 = '\0';
        }
        else {
          IVar4 = (INT8)((int)cVar3 / (1 << (snd->level - 1 & 0x1f)));
        }
        snd->signal = IVar4;
        snd->frequency_counter = snd->frequency;
      }
    }
  }
  return;
}

Assistant:

static void gb_update_wave_channel(gb_sound_t *gb, struct SOUND *snd, UINT32 cycles)
{
	if (snd->on)
	{
		// compensate for leftover cycles
		snd->cycles_left += cycles;

		while (snd->cycles_left >= 2)
		{
			snd->cycles_left -= 2;

			// Calculate next state
			snd->frequency_counter = (snd->frequency_counter + 1) & 0x7ff;
			snd->sample_reading = false;
			if (gb->gbMode == GBMODE_DMG && snd->frequency_counter == 0x7ff)
				snd->offset = (snd->offset + 1) & 0x1F;
			if (snd->frequency_counter == 0)
			{
				// Read next sample
				snd->sample_reading = true;
				if (gb->gbMode == GBMODE_CGB04)
					snd->offset = (snd->offset + 1) & 0x1f;
				snd->current_sample = gb->snd_regs[AUD3W0 + (snd->offset/2)];
				if (!(snd->offset & 0x01))
				{
					snd->current_sample >>= 4;
				}
				snd->current_sample = (snd->current_sample & 0x0f) - 8;
				if (gb->BoostWaveChn)
					snd->current_sample <<= 1;

				snd->signal = snd->level ? snd->current_sample / (1 << (snd->level - 1)) : 0;

				// Reload frequency counter
				snd->frequency_counter = snd->frequency;
			}
		}
	}
}